

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AESKey.cpp
# Opt level: O0

ByteString * __thiscall AESKey::getKeyCheckValue(AESKey *this)

{
  long *plVar1;
  byte bVar2;
  int iVar3;
  CryptoFactory *pCVar4;
  undefined4 extraout_var;
  uchar *__s;
  size_t __n;
  undefined8 in_RSI;
  ByteString *in_RDI;
  SymmetricAlgorithm *cipher;
  ByteString encryptedFinal;
  ByteString data;
  ByteString iv;
  ByteString *encryptedData;
  size_t in_stack_fffffffffffffeb8;
  undefined1 *newSize;
  ByteString *in_stack_fffffffffffffec0;
  ByteString *this_00;
  ByteString *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  uint uVar5;
  byte in_stack_fffffffffffffee4;
  byte in_stack_fffffffffffffee5;
  byte bVar6;
  undefined1 local_d0 [44];
  undefined4 local_a4;
  long *local_a0;
  undefined1 local_98 [43];
  byte local_6d;
  undefined1 local_60 [40];
  undefined1 local_38 [56];
  
  ByteString::ByteString((ByteString *)0x1a3a9e);
  ByteString::ByteString((ByteString *)0x1a3aab);
  local_6d = 0;
  ByteString::ByteString((ByteString *)0x1a3abf);
  ByteString::ByteString((ByteString *)0x1a3ace);
  pCVar4 = CryptoFactory::i();
  iVar3 = (**pCVar4->_vptr_CryptoFactory)(pCVar4,1);
  local_a0 = (long *)CONCAT44(extraout_var,iVar3);
  if (local_a0 != (long *)0x0) {
    (**(code **)(*local_a0 + 0x68))();
    ByteString::resize(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    __s = ByteString::operator[](in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    __n = ByteString::size((ByteString *)0x1a3bda);
    memset(__s,0,__n);
    plVar1 = local_a0;
    ByteString::ByteString((ByteString *)0x1a3c09);
    newSize = local_d0;
    this_00 = (ByteString *)0x0;
    bVar2 = (**(code **)(*plVar1 + 0x10))(plVar1,in_RSI,4,local_38,0,0);
    bVar6 = 1;
    if ((bVar2 & 1) != 0) {
      in_stack_fffffffffffffee5 = (**(code **)(*local_a0 + 0x18))(local_a0,local_60,in_RDI);
      bVar6 = 1;
      if ((in_stack_fffffffffffffee5 & 1) != 0) {
        in_stack_fffffffffffffee4 = (**(code **)(*local_a0 + 0x20))(local_a0,local_98);
        bVar6 = in_stack_fffffffffffffee4 ^ 0xff;
      }
    }
    uVar5 = CONCAT13(bVar6,(int3)in_stack_fffffffffffffee0);
    ByteString::~ByteString((ByteString *)0x1a3ccb);
    if ((uVar5 & 0x1000000) == 0) {
      pCVar4 = CryptoFactory::i();
      (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,local_a0);
      ByteString::operator+=
                ((ByteString *)
                 CONCAT17(bVar2,CONCAT16(bVar6,CONCAT15(in_stack_fffffffffffffee5,
                                                        CONCAT14(in_stack_fffffffffffffee4,uVar5))))
                 ,in_stack_fffffffffffffed8);
      ByteString::resize(this_00,(size_t)newSize);
    }
    else {
      pCVar4 = CryptoFactory::i();
      (*pCVar4->_vptr_CryptoFactory[1])(pCVar4,local_a0);
    }
  }
  local_6d = 1;
  local_a4 = 1;
  ByteString::~ByteString((ByteString *)0x1a3d97);
  if ((local_6d & 1) == 0) {
    ByteString::~ByteString((ByteString *)0x1a3dbc);
  }
  ByteString::~ByteString((ByteString *)0x1a3dc9);
  ByteString::~ByteString((ByteString *)0x1a3dd6);
  return in_RDI;
}

Assistant:

ByteString AESKey::getKeyCheckValue() const
{
	ByteString iv;
	ByteString data;
	ByteString encryptedData;
	ByteString encryptedFinal;

	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(SymAlgo::AES);
	if (cipher == NULL) return encryptedData;

	// Single block of null (0x00) bytes
	data.resize(cipher->getBlockSize());
	memset(&data[0], 0, data.size());

	if (!cipher->encryptInit(this, SymMode::ECB, iv, false) ||
	    !cipher->encryptUpdate(data, encryptedData) ||
	    !cipher->encryptFinal(encryptedFinal))
	{
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return encryptedData;
	}
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);

	encryptedData += encryptedFinal;
	encryptedData.resize(3);

	return encryptedData;
}